

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v7::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char buf [7];
  anon_class_8_1_8991fb9c transcode;
  char local_40 [8];
  anon_class_8_1_8991fb9c local_38;
  
  uVar4 = s.size_;
  pcVar5 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (wchar_t *)0x0;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_00740d50;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar3 = pcVar5;
  local_38.this = this;
  if (3 < uVar4) {
    for (; pcVar3 < pcVar5 + (uVar4 - 3);
        pcVar3 = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()(&local_38,pcVar3)) {
    }
  }
  pcVar5 = pcVar5 + (uVar4 - (long)pcVar3);
  if (pcVar5 != (char *)0x0) {
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    if ((long)pcVar5 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    memcpy(local_40,pcVar3,(size_t)pcVar5);
    pcVar3 = local_40;
    do {
      pcVar3 = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()(&local_38,pcVar3);
    } while ((long)pcVar3 - (long)local_40 < (long)pcVar5);
  }
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ <
      (this->buffer_).super_buffer<wchar_t>.size_ + 1) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
  (this->buffer_).super_buffer<wchar_t>.size_ = sVar2 + 1;
  pwVar1[sVar2] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}